

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_File_Chooser2.cxx
# Opt level: O1

void __thiscall Fl_File_Chooser::update_preview(Fl_File_Chooser *this)

{
  int iVar1;
  Fl_Widget *pFVar2;
  Fl_Box *pFVar3;
  bool bVar4;
  long lVar5;
  byte bVar6;
  int iVar7;
  char *n;
  FILE *__stream;
  size_t sVar8;
  Fl_Shared_Image *pFVar9;
  undefined4 extraout_var;
  Fl_Fontsize FVar10;
  uint uVar11;
  uint uVar13;
  char *pcVar14;
  long lVar15;
  Fl_Shared_Image *this_00;
  stat s;
  stat local_c0;
  ulong uVar12;
  
  if ((this->previewButton->super_Fl_Light_Button).super_Fl_Button.value_ == '\0') {
    return;
  }
  n = value(this,1);
  if (n == (char *)0x0) {
    bVar4 = false;
LAB_001ab06d:
    this_00 = (Fl_Shared_Image *)0x0;
LAB_001ab070:
    pcVar14 = (char *)0x0;
  }
  else {
    iVar7 = fl_filename_isdir(n);
    if (iVar7 == 0) {
      iVar7 = fl_stat(n,&local_c0);
      bVar4 = true;
      if (iVar7 != 0) goto LAB_001ab06d;
      if ((local_c0.st_mode & 0xf000) == 0x8000) {
        if (local_c0.st_size != 0) {
          Fl_Window::cursor(&this->window->super_Fl_Window,FL_CURSOR_WAIT);
          Fl::check();
          pFVar9 = Fl_Shared_Image::get(n,0,0);
          this_00 = (Fl_Shared_Image *)0x0;
          if (pFVar9 != (Fl_Shared_Image *)0x0) {
            bVar4 = false;
            Fl_Window::cursor(&this->window->super_Fl_Window,FL_CURSOR_DEFAULT);
            Fl::check();
            this_00 = pFVar9;
          }
          goto LAB_001ab070;
        }
        pcVar14 = "<empty file>";
      }
      else {
        pcVar14 = "@-3refresh";
      }
    }
    else {
      pcVar14 = "@fileopen";
    }
    bVar4 = false;
    this_00 = (Fl_Shared_Image *)0x0;
  }
  pFVar9 = (Fl_Shared_Image *)(this->previewBox->super_Fl_Widget).label_.image;
  if (pFVar9 != (Fl_Shared_Image *)0x0) {
    Fl_Shared_Image::release(pFVar9);
  }
  pFVar2 = &this->previewBox->super_Fl_Widget;
  (pFVar2->label_).image = (Fl_Image *)0x0;
  if (bVar4) {
    if (n == (char *)0x0) {
      __stream = (FILE *)0x0;
    }
    else {
      __stream = (FILE *)fl_fopen(n,"rb");
    }
    pcVar14 = this->preview_text_;
    if (__stream == (FILE *)0x0) {
      *pcVar14 = '\0';
    }
    else {
      sVar8 = fread(pcVar14,1,0x7ff,__stream);
      pcVar14[(int)sVar8] = '\0';
      fclose(__stream);
    }
    Fl_Window::cursor(&this->window->super_Fl_Window,FL_CURSOR_DEFAULT);
    Fl::check();
    lVar15 = 0x1010;
    bVar6 = this->preview_text_[0];
    while (bVar6 != 0) {
      uVar11 = (uint)bVar6;
      if ((char)bVar6 < '\0') {
        if ((uVar11 & 0xffffffe0) == 0xc0) {
          if (this->directory_[lVar15 + -0xf] == '\0') {
            lVar15 = lVar15 + 1;
            goto LAB_001ab2c0;
          }
        }
        else if ((uVar11 & 0xfffffff0) == 0xe0) {
          if (this->directory_[lVar15 + -0xf] == '\0') {
            if (this->directory_[lVar15 + -0xe] == '\0') {
              lVar15 = lVar15 + 2;
              goto LAB_001ab2c0;
            }
LAB_001ab2c4:
            lVar15 = lVar15 + 1;
          }
        }
        else {
          if ((bVar6 & 0xfffffff8) != 0xf0) goto LAB_001ab2c0;
          if (this->directory_[lVar15 + -0xf] == '\0') {
            if (this->directory_[lVar15 + -0xe] != '\0') goto LAB_001ab2c4;
            if (this->directory_[lVar15 + -0xd] == '\0') {
              lVar15 = lVar15 + 3;
              goto LAB_001ab2c0;
            }
            lVar15 = lVar15 + 2;
          }
        }
LAB_001ab2c7:
        bVar4 = false;
      }
      else {
        iVar7 = isprint((uint)bVar6);
        if ((iVar7 == 0) && (iVar7 = isspace(uVar11), iVar7 == 0)) goto LAB_001ab2c7;
LAB_001ab2c0:
        bVar4 = true;
      }
      if (!bVar4) break;
      lVar5 = lVar15 + -0xf;
      lVar15 = lVar15 + 1;
      bVar6 = this->directory_[lVar5];
    }
    if ((lVar15 == 0x1010) || (this->directory_[lVar15 + -0x10] != '\0')) {
      lVar15 = 0x1010;
      bVar6 = this->preview_text_[0];
      while (bVar6 != 0) {
        iVar7 = isprint((uint)bVar6);
        if ((iVar7 == 0) && (iVar7 = isspace((uint)bVar6), iVar7 == 0)) break;
        lVar5 = lVar15 + -0xf;
        lVar15 = lVar15 + 1;
        bVar6 = this->directory_[lVar5];
      }
    }
    pFVar2 = &this->previewBox->super_Fl_Widget;
    if ((lVar15 == 0x1010) || (this->directory_[lVar15 + -0x10] != '\0')) {
      pcVar14 = "?";
      if (n == (char *)0x0) {
        pcVar14 = (char *)0x0;
      }
      Fl_Widget::label(pFVar2,pcVar14);
      pFVar3 = this->previewBox;
      (pFVar3->super_Fl_Widget).label_.align_ = 0x40;
      (pFVar3->super_Fl_Widget).label_.font = 0;
      (pFVar3->super_Fl_Widget).label_.size = 0x4b;
    }
    else {
      uVar11 = 6;
      if ((0x77 < pFVar2->h_) &&
         (uVar13 = (uint)pFVar2->h_ / 0x14, uVar11 = FL_NORMAL_SIZE, (int)uVar13 < FL_NORMAL_SIZE))
      {
        uVar11 = uVar13;
      }
      Fl_Widget::label(pFVar2,pcVar14);
      pFVar3 = this->previewBox;
      (pFVar3->super_Fl_Widget).label_.align_ = 0x55;
      (pFVar3->super_Fl_Widget).label_.size = uVar11;
      (pFVar3->super_Fl_Widget).label_.font = 4;
    }
  }
  else if (this_00 == (Fl_Shared_Image *)0x0) {
    if (pcVar14 != (char *)0x0) {
      Fl_Widget::label(pFVar2,pcVar14);
      pFVar3 = this->previewBox;
      (pFVar3->super_Fl_Widget).label_.align_ = 0x40;
      FVar10 = 0xc;
      if (*pcVar14 == '@') {
        FVar10 = 0x4b;
      }
      (pFVar3->super_Fl_Widget).label_.size = FVar10;
      (pFVar3->super_Fl_Widget).label_.font = 0;
    }
  }
  else {
    iVar7 = (this_00->super_Fl_Image).w_;
    if ((((iVar7 < 1) || (iVar1 = (this_00->super_Fl_Image).h_, iVar1 < 1)) ||
        ((this_00->super_Fl_Image).d_ < 0)) || ((this_00->super_Fl_Image).count_ < 1)) {
      Fl_Widget::label(pFVar2,"X");
      pFVar2 = &this->previewBox->super_Fl_Widget;
      (pFVar2->label_).align_ = 0x40;
      (pFVar2->label_).font = 0;
      (pFVar2->label_).size = 0x46;
      Fl_Widget::redraw(pFVar2);
    }
    else {
      uVar11 = pFVar2->w_ - 0x14;
      uVar12 = (ulong)uVar11;
      uVar13 = pFVar2->h_ - 0x14;
      if (((int)uVar11 < iVar7) || ((int)uVar13 < iVar1)) {
        uVar11 = (int)(uVar11 * iVar1) / iVar7;
        if ((int)uVar13 < (int)uVar11) {
          uVar12 = (long)(int)(iVar7 * uVar13) / (long)iVar1 & 0xffffffff;
          uVar11 = uVar13;
        }
        iVar7 = (*(this_00->super_Fl_Image)._vptr_Fl_Image[2])(this_00,uVar12,(ulong)uVar11);
        (this->previewBox->super_Fl_Widget).label_.image = (Fl_Image *)CONCAT44(extraout_var,iVar7);
        Fl_Shared_Image::release(this_00);
      }
      else {
        (pFVar2->label_).image = &this_00->super_Fl_Image;
      }
      pFVar2 = &this->previewBox->super_Fl_Widget;
      (pFVar2->label_).align_ = 0x40;
      Fl_Widget::label(pFVar2,(char *)0x0);
    }
  }
  Fl_Widget::redraw(&this->previewBox->super_Fl_Widget);
  return;
}

Assistant:

void
Fl_File_Chooser::update_preview()
{
  const char		*filename;	// Current filename
  const char            *newlabel = 0;  // New label text
  Fl_Shared_Image	*image = 0,     // New image
			*oldimage;	// Old image
  int			pbw, pbh;	// Width and height of preview box
  int			w, h;		// Width and height of preview image
  int                   set = 0;        // Set this flag as soon as a decent preview is found

  if (!previewButton->value()) return;

  filename = value();
  if (filename == NULL) {
    // no file name at all, so we have an empty preview
    set = 1;
  } else if (fl_filename_isdir(filename)) {
    // filename is a directory, show a folder icon
    newlabel = "@fileopen";
    set = 1;
  } else {
    struct stat s;
    if (fl_stat(filename, &s)==0) {
      if ((s.st_mode&S_IFMT)!=S_IFREG) {
        // this is no regular file, probably some kind of device
        newlabel = "@-3refresh"; // a cross
        set = 1;
      } else if (s.st_size==0) {
        // this file is emty
        newlabel = "<empty file>";
        set = 1;
      } else {
        // if this file is an image, try to load it
        window->cursor(FL_CURSOR_WAIT);
        Fl::check();
        
        image = Fl_Shared_Image::get(filename);
        
        if (image) {
          window->cursor(FL_CURSOR_DEFAULT);
          Fl::check();
          set = 1;
        }
      }
    }
  }

  oldimage = (Fl_Shared_Image *)previewBox->image();

  if (oldimage) oldimage->release();

  previewBox->image(0);

  if (!set) {
    FILE	*fp;
    int		bytes;
    char	*ptr;

    if (filename) fp = fl_fopen(filename, "rb");
    else fp = NULL;

    if (fp != NULL) {
      // Try reading the first 1k of data for a label...
      bytes = (int) fread(preview_text_, 1, sizeof(preview_text_) - 1, fp);
      preview_text_[bytes] = '\0';
      fclose(fp);
    } else {
      // Assume we can't read any data...
      preview_text_[0] = '\0';
    }

    window->cursor(FL_CURSOR_DEFAULT);
    Fl::check();

    // Scan the buffer for printable UTF8 chars...
    for (ptr = preview_text_; *ptr; ptr++) {
      uchar c = uchar(*ptr);
      if ( (c&0x80)==0 ) {
        if (!isprint(c&255) && !isspace(c&255)) break;
      } else if ( (c&0xe0)==0xc0 ) {
        if (ptr[1] && (ptr[1]&0xc0)!=0x80) break;
        ptr++;
      } else if ( (c&0xf0)==0xe0 ) {
        if (ptr[1] && (ptr[1]&0xc0)!=0x80) break;
        ptr++;
        if (ptr[1] && (ptr[1]&0xc0)!=0x80) break;
        ptr++;
      } else if ( (c&0xf8)==0xf0 ) {
        if (ptr[1] && (ptr[1]&0xc0)!=0x80) break;
        ptr++;
        if (ptr[1] && (ptr[1]&0xc0)!=0x80) break;
        ptr++;
        if (ptr[1] && (ptr[1]&0xc0)!=0x80) break;
        ptr++;
      }
    } 
//         *ptr && (isprint(*ptr & 255) || isspace(*ptr & 255));
//	 ptr ++);

    // Scan the buffer for printable characters in 8 bit
    if (*ptr || ptr == preview_text_) {
      for (ptr = preview_text_;
         *ptr && (isprint(*ptr & 255) || isspace(*ptr & 255));
	 ptr ++) {/*empty*/}
    }

    if (*ptr || ptr == preview_text_) {
      // Non-printable file, just show a big ?...
      previewBox->label(filename ? "?" : 0);
      previewBox->align(FL_ALIGN_CLIP);
      previewBox->labelsize(75);
      previewBox->labelfont(FL_HELVETICA);
    } else {
      // Show the first 1k of text...
      int size = previewBox->h() / 20;
      if (size < 6) size = 6;
      else if (size > FL_NORMAL_SIZE) size = FL_NORMAL_SIZE;

      previewBox->label(preview_text_);
      previewBox->align((Fl_Align)(FL_ALIGN_CLIP | FL_ALIGN_INSIDE |
                                   FL_ALIGN_LEFT | FL_ALIGN_TOP));
      previewBox->labelsize(size);
      previewBox->labelfont(FL_COURIER);
    }
  } else if (image && ( (image->w() <= 0) ||
                        (image->h() <= 0) ||
                        (image->d() < 0)  ||
                        (image->count() <= 0))) {
    // Image has errors? Show big 'X'
    previewBox->label("X");
    previewBox->align(FL_ALIGN_CLIP);
    previewBox->labelsize(70);
    previewBox->labelfont(FL_HELVETICA);
    previewBox->redraw();
  } else if (image) {
    pbw = previewBox->w() - 20;
    pbh = previewBox->h() - 20;

    if (image->w() > pbw || image->h() > pbh) {
      w   = pbw;
      h   = w * image->h() / image->w();

      if (h > pbh) {
	h = pbh;
	w = h * image->w() / image->h();
      }

      oldimage = (Fl_Shared_Image *)image->copy(w, h);
      previewBox->image((Fl_Image *)oldimage);

      image->release();
    } else {
      previewBox->image((Fl_Image *)image);
    }

    previewBox->align(FL_ALIGN_CLIP);
    previewBox->label(0);
  } else if (newlabel) {
    previewBox->label(newlabel);
    previewBox->align(FL_ALIGN_CLIP);
    previewBox->labelsize(newlabel[0]=='@'?75:12);
    previewBox->labelfont(FL_HELVETICA);
  }

  previewBox->redraw();
}